

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O2

void Test_Demangle_FromFile::RunTest(void)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  string line;
  string mangled;
  string test_file;
  string demangled;
  ifstream f;
  byte abStack_218 [488];
  
  std::operator+(&test_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 fLS::FLAGS_test_srcdir_buf_abi_cxx11_,"/src/demangle_unittest.txt");
  std::ifstream::ifstream(&f,test_file._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      do {
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&f,(string *)&line);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
          std::__cxx11::string::~string((string *)&line);
          std::ifstream::~ifstream(&f);
          std::__cxx11::string::~string((string *)&test_file);
          return;
        }
      } while ((line._M_string_length == 0) || (*line._M_dataplus._M_p == '#'));
      lVar3 = std::__cxx11::string::find((char)&line,9);
      if (lVar3 == -1) break;
      std::__cxx11::string::substr((ulong)&mangled,(ulong)&line);
      std::__cxx11::string::substr((ulong)&demangled,(ulong)&line);
      pcVar4 = DemangleIt(mangled._M_dataplus._M_p);
      bVar1 = std::operator==(&demangled,pcVar4);
      if (!bVar1) {
        pcVar5 = "demangled";
        pcVar4 = "==";
        pcVar6 = "DemangleIt(mangled.c_str())";
        goto LAB_00109e82;
      }
      std::__cxx11::string::~string((string *)&demangled);
      std::__cxx11::string::~string((string *)&mangled);
    }
    pcVar5 = "string::npos";
    pcVar4 = "!=";
    pcVar6 = "tab_pos";
LAB_00109e82:
    fprintf(_stderr,"Check failed: %s %s %s\n",pcVar5,pcVar4,pcVar6);
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","!(f.fail())");
  }
  exit(1);
}

Assistant:

TEST(Demangle, FromFile) {
  string test_file = FLAGS_test_srcdir + "/src/demangle_unittest.txt";
  ifstream f(test_file.c_str());  // The file should exist.
  EXPECT_FALSE(f.fail());

  string line;
  while (getline(f, line)) {
    // Lines start with '#' are considered as comments.
    if (line.empty() || line[0] == '#') {
      continue;
    }
    // Each line should contain a mangled name and a demangled name
    // separated by '\t'.  Example: "_Z3foo\tfoo"
    string::size_type tab_pos = line.find('\t');
    EXPECT_NE(string::npos, tab_pos);
    string mangled = line.substr(0, tab_pos);
    string demangled = line.substr(tab_pos + 1);
    EXPECT_EQ(demangled, DemangleIt(mangled.c_str()));
  }
}